

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall Diligent::ThreadPoolImpl::WaitForAllTasks(ThreadPoolImpl *this)

{
  bool bVar1;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  ThreadPoolImpl *this_local;
  memory_order __b;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_38,&this->m_TasksQueueMtx);
  bVar1 = std::
          multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
          ::empty(&this->m_TasksQueue);
  if ((!bVar1) ||
     (std::operator&(memory_order_seq_cst,__memory_order_mask),
     0 < (this->m_NumRunningTasks).super___atomic_base<int>._M_i)) {
    std::condition_variable::wait<Diligent::ThreadPoolImpl::WaitForAllTasks()::_lambda()_1_>
              (&this->m_TasksFinishedCond,(unique_lock<std::mutex> *)local_38,
               (anon_class_8_1_8991fb9c)this);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return;
}

Assistant:

WaitForAllTasks() override final
    {
        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
        if (!m_TasksQueue.empty() || m_NumRunningTasks.load() > 0)
        {
            m_TasksFinishedCond.wait(lock,
                                     [this] //
                                     {
                                         return m_TasksQueue.empty() && m_NumRunningTasks.load() == 0;
                                     } //
            );
        }
    }